

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O0

void __thiscall ED::JoinAnchorPointsUsingSortedAnchors(ED *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  reference pvVar9;
  reference pvVar10;
  reference this_00;
  Point_<int> *local_1e8;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_1c8;
  int local_1a8;
  int local_1a4;
  int l_2;
  int dc_6;
  int dr_6;
  int fc_5;
  int fr_5;
  int chainLen_2;
  int startIndex_1;
  int dc_5;
  int dr_5;
  int index_2;
  int fc_4;
  int fr_4;
  int chainNo_2;
  int k_5;
  int count_2;
  int k_4;
  pointer pPStack_160;
  pointer local_158;
  Point_<int> *local_150;
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_148;
  const_iterator local_140;
  int local_138;
  int local_134;
  int dc;
  int dr;
  int fc;
  int fr;
  int l_1;
  int dc_4;
  int dr_4;
  int fc_3;
  int fr_3;
  int chainLen_1;
  int startIndex;
  int dc_3;
  int dr_3;
  int index_1;
  int fc_2;
  int fr_2;
  int chainNo_1;
  int k_3;
  int lastChainNo;
  int count_1;
  int l;
  int dc_2;
  int dr_2;
  int dc_1;
  int dr_1;
  int index;
  int fc_1;
  int fr_1;
  int chainNo;
  int k_2;
  int count;
  int totalLen;
  int noSegmentPixels;
  int k_1;
  int C_3;
  int B_3;
  int A_4;
  int C_2;
  int B_2;
  int A_3;
  int C_1;
  int B_1;
  int A_2;
  int C;
  int B;
  int A_1;
  int chainLen;
  int parent;
  int dir;
  int c;
  int r;
  int top;
  int duplicatePixelCount;
  int len;
  int noChains;
  int j;
  int i;
  int pixelOffset;
  int k;
  int totalPixels;
  int *A;
  Chain *chains;
  StackNode *stack;
  Point_<int> *local_20;
  Point *pixels;
  int *chainNos;
  ED *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)((this->width + this->height) * 8);
  uVar7 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  chainNos = &this->width;
  pixels = (Point *)operator_new__(uVar7);
  uVar7 = (ulong)(this->width * this->height);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  uVar8 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  local_20 = (Point_<int> *)operator_new__(uVar8);
  if (uVar7 != 0) {
    local_1e8 = local_20;
    do {
      cv::Point_<int>::Point_(local_1e8);
      local_1e8 = local_1e8 + 1;
    } while (local_1e8 != local_20 + uVar7);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(this->width * this->height);
  uVar7 = SUB168(auVar3 * ZEXT816(0x10),0);
  if (SUB168(auVar3 * ZEXT816(0x10),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  chains = (Chain *)operator_new__(uVar7);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(this->width * this->height);
  uVar7 = SUB168(auVar4 * ZEXT816(0x20),0);
  if (SUB168(auVar4 * ZEXT816(0x20),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  A = (int *)operator_new__(uVar7);
  _k = sortAnchorsByGradValue1(this);
  pixelOffset = 0;
  i = this->anchorNos;
  do {
    do {
      i = i + -1;
      if (i < 0) {
        std::
        vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ::pop_back(&this->segmentPoints);
        if (_k != (int *)0x0) {
          operator_delete__(_k);
        }
        if (A != (int *)0x0) {
          operator_delete__(A);
        }
        if (chains != (Chain *)0x0) {
          operator_delete__(chains);
        }
        if (pixels != (Point *)0x0) {
          operator_delete__(pixels);
        }
        if (local_20 != (Point_<int> *)0x0) {
          operator_delete__(local_20);
        }
        return;
      }
      j = _k[i];
      noChains = j / this->width;
      len = j % this->width;
    } while (this->edgeImg[noChains * this->width + len] != 0xfe);
    A[1] = 0;
    A[2] = -1;
    *A = 0;
    A[4] = -1;
    A[3] = -1;
    A[6] = 0;
    A[7] = 0;
    duplicatePixelCount = 1;
    top = 0;
    r = 0;
    if (this->dirImg[noChains * this->width + len] == '\x01') {
      chains->dir = noChains;
      chains->len = len;
      chains->children[0] = 4;
      chains->parent = 0;
      chains->children[1] = noChains;
      *(int *)&chains->field_0x14 = len;
      *(undefined4 *)((long)&chains->pixels + 4) = 3;
      *(undefined4 *)&chains->pixels = 0;
    }
    else {
      chains->dir = noChains;
      chains->len = len;
      chains->children[0] = 2;
      chains->parent = 0;
      chains->children[1] = noChains;
      *(int *)&chains->field_0x14 = len;
      *(undefined4 *)((long)&chains->pixels + 4) = 1;
      *(undefined4 *)&chains->pixels = 0;
    }
    c = 1;
LAB_00107e0c:
    if (-1 < c) {
      dir = chains->children[(long)c * 4 + -3];
      parent = chains->children[(long)c * 4 + -2];
      chainLen = chains->children[(long)c * 4];
      A_1 = chains->children[(long)c * 4 + -1];
      iVar6 = c + -1;
      if (this->edgeImg[dir * this->width + parent] != 0xff) {
        r = r + 1;
      }
      A[(long)duplicatePixelCount * 8] = chainLen;
      A[(long)duplicatePixelCount * 8 + 2] = A_1;
      A[(long)duplicatePixelCount * 8 + 4] = -1;
      A[(long)duplicatePixelCount * 8 + 3] = -1;
      *(Point_<int> **)(A + (long)duplicatePixelCount * 8 + 6) = local_20 + top;
      local_20[top].y = dir;
      local_20[top].x = parent;
      top = top + 1;
      B = 1;
      if (chainLen == 1) {
        while (this->dirImg[dir * this->width + parent] == '\x02') {
          this->edgeImg[dir * this->width + parent] = 0xff;
          if (this->edgeImg[(dir + -1) * this->width + parent] == 0xfe) {
            this->edgeImg[(dir + -1) * this->width + parent] = '\0';
          }
          if (this->edgeImg[(dir + 1) * this->width + parent] == 0xfe) {
            this->edgeImg[(dir + 1) * this->width + parent] = '\0';
          }
          if (this->edgeImg[dir * this->width + parent + -1] < 0xfe) {
            if (this->edgeImg[(dir + -1) * this->width + parent + -1] < 0xfe) {
              if (this->edgeImg[(dir + 1) * this->width + parent + -1] < 0xfe) {
                C = (int)this->gradImg[(dir + -1) * this->width + parent + -1];
                A_2 = (int)this->gradImg[dir * this->width + parent + -1];
                B_1 = (int)this->gradImg[(dir + 1) * this->width + parent + -1];
                if (A_2 < C) {
                  if (B_1 < C) {
                    dir = dir + -1;
                  }
                  else {
                    dir = dir + 1;
                  }
                }
                else if (A_2 < B_1) {
                  dir = dir + 1;
                }
              }
              else {
                dir = dir + 1;
              }
            }
            else {
              dir = dir + -1;
            }
          }
          parent = parent + -1;
          if ((this->edgeImg[dir * this->width + parent] == 0xff) ||
             ((int)this->gradImg[dir * this->width + parent] < this->gradThresh)) {
            c = iVar6;
            if (0 < B) {
              A[(long)duplicatePixelCount * 8 + 1] = B;
              A[(long)A_1 * 8 + 3] = duplicatePixelCount;
              duplicatePixelCount = duplicatePixelCount + 1;
            }
            goto LAB_00107e0c;
          }
          local_20[top].y = dir;
          local_20[top].x = parent;
          top = top + 1;
          B = B + 1;
        }
        chains->children[(long)c * 4 + -3] = dir;
        chains->children[(long)c * 4 + -2] = parent;
        chains->children[(long)c * 4] = 4;
        chains->children[(long)c * 4 + -1] = duplicatePixelCount;
        iVar6 = c + 1;
        chains->children[(long)iVar6 * 4 + -3] = dir;
        chains->children[(long)iVar6 * 4 + -2] = parent;
        chains->children[(long)iVar6 * 4] = 3;
        chains->children[(long)iVar6 * 4 + -1] = duplicatePixelCount;
        B = B + -1;
        A[(long)duplicatePixelCount * 8 + 1] = B;
        A[(long)A_1 * 8 + 3] = duplicatePixelCount;
      }
      else if (chainLen == 2) {
        while (this->dirImg[dir * this->width + parent] == '\x02') {
          this->edgeImg[dir * this->width + parent] = 0xff;
          if (this->edgeImg[(dir + 1) * this->width + parent] == 0xfe) {
            this->edgeImg[(dir + 1) * this->width + parent] = '\0';
          }
          if (this->edgeImg[(dir + -1) * this->width + parent] == 0xfe) {
            this->edgeImg[(dir + -1) * this->width + parent] = '\0';
          }
          if (this->edgeImg[dir * this->width + parent + 1] < 0xfe) {
            if (this->edgeImg[(dir + 1) * this->width + parent + 1] < 0xfe) {
              if (this->edgeImg[(dir + -1) * this->width + parent + 1] < 0xfe) {
                C_1 = (int)this->gradImg[(dir + -1) * this->width + parent + 1];
                A_3 = (int)this->gradImg[dir * this->width + parent + 1];
                B_2 = (int)this->gradImg[(dir + 1) * this->width + parent + 1];
                if (A_3 < C_1) {
                  if (B_2 < C_1) {
                    dir = dir + -1;
                  }
                  else {
                    dir = dir + 1;
                  }
                }
                else if (A_3 < B_2) {
                  dir = dir + 1;
                }
              }
              else {
                dir = dir + -1;
              }
            }
            else {
              dir = dir + 1;
            }
          }
          parent = parent + 1;
          if ((this->edgeImg[dir * this->width + parent] == 0xff) ||
             ((int)this->gradImg[dir * this->width + parent] < this->gradThresh)) {
            c = iVar6;
            if (0 < B) {
              A[(long)duplicatePixelCount * 8 + 1] = B;
              A[(long)A_1 * 8 + 4] = duplicatePixelCount;
              duplicatePixelCount = duplicatePixelCount + 1;
            }
            goto LAB_00107e0c;
          }
          local_20[top].y = dir;
          local_20[top].x = parent;
          top = top + 1;
          B = B + 1;
        }
        chains->children[(long)c * 4 + -3] = dir;
        chains->children[(long)c * 4 + -2] = parent;
        chains->children[(long)c * 4] = 4;
        chains->children[(long)c * 4 + -1] = duplicatePixelCount;
        iVar6 = c + 1;
        chains->children[(long)iVar6 * 4 + -3] = dir;
        chains->children[(long)iVar6 * 4 + -2] = parent;
        chains->children[(long)iVar6 * 4] = 3;
        chains->children[(long)iVar6 * 4 + -1] = duplicatePixelCount;
        B = B + -1;
        A[(long)duplicatePixelCount * 8 + 1] = B;
        A[(long)A_1 * 8 + 4] = duplicatePixelCount;
      }
      else if (chainLen == 3) {
        while (this->dirImg[dir * this->width + parent] == '\x01') {
          this->edgeImg[dir * this->width + parent] = 0xff;
          if (this->edgeImg[dir * this->width + parent + -1] == 0xfe) {
            this->edgeImg[dir * this->width + parent + -1] = '\0';
          }
          if (this->edgeImg[dir * this->width + parent + 1] == 0xfe) {
            this->edgeImg[dir * this->width + parent + 1] = '\0';
          }
          if (this->edgeImg[(dir + -1) * this->width + parent] < 0xfe) {
            if (this->edgeImg[(dir + -1) * this->width + parent + -1] < 0xfe) {
              if (this->edgeImg[(dir + -1) * this->width + parent + 1] < 0xfe) {
                C_2 = (int)this->gradImg[(dir + -1) * this->width + parent + -1];
                A_4 = (int)this->gradImg[(dir + -1) * this->width + parent];
                B_3 = (int)this->gradImg[(dir + -1) * this->width + parent + 1];
                if (A_4 < C_2) {
                  if (B_3 < C_2) {
                    parent = parent + -1;
                  }
                  else {
                    parent = parent + 1;
                  }
                }
                else if (A_4 < B_3) {
                  parent = parent + 1;
                }
              }
              else {
                parent = parent + 1;
              }
            }
            else {
              parent = parent + -1;
            }
          }
          dir = dir + -1;
          if ((this->edgeImg[dir * this->width + parent] == 0xff) ||
             ((int)this->gradImg[dir * this->width + parent] < this->gradThresh)) {
            c = iVar6;
            if (0 < B) {
              A[(long)duplicatePixelCount * 8 + 1] = B;
              A[(long)A_1 * 8 + 3] = duplicatePixelCount;
              duplicatePixelCount = duplicatePixelCount + 1;
            }
            goto LAB_00107e0c;
          }
          local_20[top].y = dir;
          local_20[top].x = parent;
          top = top + 1;
          B = B + 1;
        }
        chains->children[(long)c * 4 + -3] = dir;
        chains->children[(long)c * 4 + -2] = parent;
        chains->children[(long)c * 4] = 2;
        chains->children[(long)c * 4 + -1] = duplicatePixelCount;
        iVar6 = c + 1;
        chains->children[(long)iVar6 * 4 + -3] = dir;
        chains->children[(long)iVar6 * 4 + -2] = parent;
        chains->children[(long)iVar6 * 4] = 1;
        chains->children[(long)iVar6 * 4 + -1] = duplicatePixelCount;
        B = B + -1;
        A[(long)duplicatePixelCount * 8 + 1] = B;
        A[(long)A_1 * 8 + 3] = duplicatePixelCount;
      }
      else {
        while (this->dirImg[dir * this->width + parent] == '\x01') {
          this->edgeImg[dir * this->width + parent] = 0xff;
          if (this->edgeImg[dir * this->width + parent + 1] == 0xfe) {
            this->edgeImg[dir * this->width + parent + 1] = '\0';
          }
          if (this->edgeImg[dir * this->width + parent + -1] == 0xfe) {
            this->edgeImg[dir * this->width + parent + -1] = '\0';
          }
          if (this->edgeImg[(dir + 1) * this->width + parent] < 0xfe) {
            if (this->edgeImg[(dir + 1) * this->width + parent + 1] < 0xfe) {
              if (this->edgeImg[(dir + 1) * this->width + parent + -1] < 0xfe) {
                C_3 = (int)this->gradImg[(dir + 1) * this->width + parent + -1];
                k_1 = (int)this->gradImg[(dir + 1) * this->width + parent];
                noSegmentPixels = (int)this->gradImg[(dir + 1) * this->width + parent + 1];
                if (k_1 < C_3) {
                  if (noSegmentPixels < C_3) {
                    parent = parent + -1;
                  }
                  else {
                    parent = parent + 1;
                  }
                }
                else if (k_1 < noSegmentPixels) {
                  parent = parent + 1;
                }
              }
              else {
                parent = parent + -1;
              }
            }
            else {
              parent = parent + 1;
            }
          }
          dir = dir + 1;
          if ((this->edgeImg[dir * this->width + parent] == 0xff) ||
             ((int)this->gradImg[dir * this->width + parent] < this->gradThresh)) {
            c = iVar6;
            if (0 < B) {
              A[(long)duplicatePixelCount * 8 + 1] = B;
              A[(long)A_1 * 8 + 4] = duplicatePixelCount;
              duplicatePixelCount = duplicatePixelCount + 1;
            }
            goto LAB_00107e0c;
          }
          local_20[top].y = dir;
          local_20[top].x = parent;
          top = top + 1;
          B = B + 1;
        }
        chains->children[(long)c * 4 + -3] = dir;
        chains->children[(long)c * 4 + -2] = parent;
        chains->children[(long)c * 4] = 2;
        chains->children[(long)c * 4 + -1] = duplicatePixelCount;
        iVar6 = c + 1;
        chains->children[(long)iVar6 * 4 + -3] = dir;
        chains->children[(long)iVar6 * 4 + -2] = parent;
        chains->children[(long)iVar6 * 4] = 1;
        chains->children[(long)iVar6 * 4 + -1] = duplicatePixelCount;
        B = B + -1;
        A[(long)duplicatePixelCount * 8 + 1] = B;
        A[(long)A_1 * 8 + 4] = duplicatePixelCount;
      }
      top = top + -1;
      duplicatePixelCount = duplicatePixelCount + 1;
      c = c + 1;
      goto LAB_00107e0c;
    }
    if (top - r < this->minPathLen) {
      for (totalLen = 0; totalLen < top; totalLen = totalLen + 1) {
        this->edgeImg[local_20[totalLen].y * this->width + local_20[totalLen].x] = '\0';
        this->edgeImg[local_20[totalLen].y * this->width + local_20[totalLen].x] = '\0';
      }
    }
    else {
      count = 0;
      k_2 = LongestChain((Chain *)A,A[4]);
      if (0 < k_2) {
        chainNo = RetrieveChainNos((Chain *)A,A[4],&pixels->x);
        fr_1 = chainNo;
        while (fr_1 = fr_1 + -1, -1 < fr_1) {
          fc_1 = (&pixels->x)[fr_1];
          index = *(int *)(*(long *)(A + (long)fc_1 * 8 + 6) + 4 +
                          (long)(A[(long)fc_1 * 8 + 1] + -1) * 8);
          dr_1 = *(int *)(*(long *)(A + (long)fc_1 * 8 + 6) + (long)(A[(long)fc_1 * 8 + 1] + -1) * 8
                         );
          for (dc_1 = count + -2; iVar6 = index, -1 < dc_1; dc_1 = dc_1 + -1) {
            pvVar9 = std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::operator[](&this->segmentPoints,(long)this->segmentNos);
            pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                                (pvVar9,(long)dc_1);
            iVar5 = dr_1;
            dr_2 = iVar6 - pvVar10->y;
            if (dr_2 < 1) {
              dr_2 = -dr_2;
            }
            pvVar9 = std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::operator[](&this->segmentPoints,(long)this->segmentNos);
            pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                                (pvVar9,(long)dc_1);
            dc_2 = iVar5 - pvVar10->x;
            if (dc_2 < 1) {
              dc_2 = -dc_2;
            }
            if ((1 < dr_2) || (1 < dc_2)) break;
            pvVar9 = std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::operator[](&this->segmentPoints,(long)this->segmentNos);
            std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::pop_back(pvVar9);
            count = count + -1;
          }
          if ((1 < A[(long)fc_1 * 8 + 1]) && (0 < count)) {
            iVar6 = *(int *)(*(long *)(A + (long)fc_1 * 8 + 6) + 4 +
                            (long)(A[(long)fc_1 * 8 + 1] + -2) * 8);
            dr_1 = *(int *)(*(long *)(A + (long)fc_1 * 8 + 6) +
                           (long)(A[(long)fc_1 * 8 + 1] + -2) * 8);
            index = iVar6;
            pvVar9 = std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::operator[](&this->segmentPoints,(long)this->segmentNos);
            pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                                (pvVar9,(long)(count + -1));
            iVar5 = dr_1;
            l = iVar6 - pvVar10->y;
            if (l < 1) {
              l = -l;
            }
            pvVar9 = std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::operator[](&this->segmentPoints,(long)this->segmentNos);
            pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                                (pvVar9,(long)(count + -1));
            count_1 = iVar5 - pvVar10->x;
            if (count_1 < 1) {
              count_1 = -count_1;
            }
            if ((l < 2) && (count_1 < 2)) {
              A[(long)fc_1 * 8 + 1] = A[(long)fc_1 * 8 + 1] + -1;
            }
          }
          lastChainNo = A[(long)fc_1 * 8 + 1];
          while (lastChainNo = lastChainNo + -1, -1 < lastChainNo) {
            pvVar9 = std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::operator[](&this->segmentPoints,(long)this->segmentNos);
            std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                      (pvVar9,(value_type *)
                              (*(long *)(A + (long)fc_1 * 8 + 6) + (long)lastChainNo * 8));
            count = count + 1;
          }
          A[(long)fc_1 * 8 + 1] = 0;
        }
      }
      k_2 = LongestChain((Chain *)A,A[3]);
      if (1 < k_2) {
        k_3 = RetrieveChainNos((Chain *)A,A[3],&pixels->x);
        chainNo_1 = pixels->x;
        *(long *)(A + (long)chainNo_1 * 8 + 6) = *(long *)(A + (long)chainNo_1 * 8 + 6) + 8;
        A[(long)chainNo_1 * 8 + 1] = A[(long)chainNo_1 * 8 + 1] + -1;
        for (fr_2 = 0; fr_2 < k_3; fr_2 = fr_2 + 1) {
          fc_2 = (&pixels->x)[fr_2];
          index_1 = *(int *)(*(long *)(A + (long)fc_2 * 8 + 6) + 4);
          dr_3 = **(int **)(A + (long)fc_2 * 8 + 6);
          for (dc_3 = count + -2; iVar6 = index_1, -1 < dc_3; dc_3 = dc_3 + -1) {
            pvVar9 = std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::operator[](&this->segmentPoints,(long)this->segmentNos);
            pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                                (pvVar9,(long)dc_3);
            iVar5 = dr_3;
            startIndex = iVar6 - pvVar10->y;
            if (startIndex < 1) {
              startIndex = -startIndex;
            }
            pvVar9 = std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::operator[](&this->segmentPoints,(long)this->segmentNos);
            pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                                (pvVar9,(long)dc_3);
            chainLen_1 = iVar5 - pvVar10->x;
            if (chainLen_1 < 1) {
              chainLen_1 = -chainLen_1;
            }
            if ((1 < startIndex) || (1 < chainLen_1)) break;
            pvVar9 = std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::operator[](&this->segmentPoints,(long)this->segmentNos);
            std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::pop_back(pvVar9);
            count = count + -1;
          }
          fr_3 = 0;
          fc_3 = A[(long)fc_2 * 8 + 1];
          if ((1 < fc_3) && (0 < count)) {
            iVar6 = *(int *)(*(long *)(A + (long)fc_2 * 8 + 6) + 0xc);
            dc_4 = *(int *)(*(long *)(A + (long)fc_2 * 8 + 6) + 8);
            dr_4 = iVar6;
            pvVar9 = std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::operator[](&this->segmentPoints,(long)this->segmentNos);
            pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                                (pvVar9,(long)(count + -1));
            iVar5 = dc_4;
            l_1 = iVar6 - pvVar10->y;
            if (l_1 < 1) {
              l_1 = -l_1;
            }
            pvVar9 = std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::operator[](&this->segmentPoints,(long)this->segmentNos);
            pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                                (pvVar9,(long)(count + -1));
            fr = iVar5 - pvVar10->x;
            if (fr < 1) {
              fr = -fr;
            }
            if ((l_1 < 2) && (fr < 2)) {
              fr_3 = 1;
            }
          }
          for (fc = fr_3; fc < A[(long)fc_2 * 8 + 1]; fc = fc + 1) {
            pvVar9 = std::
                     vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ::operator[](&this->segmentPoints,(long)this->segmentNos);
            std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                      (pvVar9,(value_type *)(*(long *)(A + (long)fc_2 * 8 + 6) + (long)fc * 8));
            count = count + 1;
          }
          A[(long)fc_2 * 8 + 1] = 0;
        }
      }
      pvVar9 = std::
               vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ::operator[](&this->segmentPoints,(long)this->segmentNos);
      pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                          (pvVar9,1);
      dr = pvVar10->y;
      pvVar9 = std::
               vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ::operator[](&this->segmentPoints,(long)this->segmentNos);
      pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                          (pvVar9,1);
      iVar5 = dr;
      dc = pvVar10->x;
      pvVar9 = std::
               vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ::operator[](&this->segmentPoints,(long)this->segmentNos);
      pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                          (pvVar9,(long)(count + -1));
      iVar6 = dc;
      local_134 = iVar5 - pvVar10->y;
      if (local_134 < 1) {
        local_134 = -local_134;
      }
      pvVar9 = std::
               vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ::operator[](&this->segmentPoints,(long)this->segmentNos);
      pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                          (pvVar9,(long)(count + -1));
      local_138 = iVar6 - pvVar10->x;
      if (local_138 < 1) {
        local_138 = -local_138;
      }
      if ((local_134 < 2) && (local_138 < 2)) {
        pvVar9 = std::
                 vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ::operator[](&this->segmentPoints,(long)this->segmentNos);
        this_00 = std::
                  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ::operator[](&this->segmentPoints,(long)this->segmentNos);
        local_148._M_current =
             (Point_<int> *)
             std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::begin(this_00);
        __gnu_cxx::
        __normal_iterator<cv::Point_<int>const*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
        ::__normal_iterator<cv::Point_<int>*>
                  ((__normal_iterator<cv::Point_<int>const*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                    *)&local_140,&local_148);
        local_150 = (Point_<int> *)
                    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::erase
                              (pvVar9,local_140);
        count = count + -1;
      }
      this->segmentNos = this->segmentNos + 1;
      _count_2 = (pointer)0x0;
      pPStack_160 = (pointer)0x0;
      local_158 = (pointer)0x0;
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&count_2);
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::push_back(&this->segmentPoints,
                  (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&count_2);
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&count_2);
      for (k_5 = 2; k_5 < duplicatePixelCount; k_5 = k_5 + 1) {
        if ((1 < A[(long)k_5 * 8 + 1]) && (k_2 = LongestChain((Chain *)A,k_5), 9 < k_2)) {
          chainNo_2 = RetrieveChainNos((Chain *)A,k_5,&pixels->x);
          count = 0;
          for (fr_4 = 0; fr_4 < chainNo_2; fr_4 = fr_4 + 1) {
            fc_4 = (&pixels->x)[fr_4];
            index_2 = *(int *)(*(long *)(A + (long)fc_4 * 8 + 6) + 4);
            dr_5 = **(int **)(A + (long)fc_4 * 8 + 6);
            for (dc_5 = count + -2; iVar6 = index_2, -1 < dc_5; dc_5 = dc_5 + -1) {
              pvVar9 = std::
                       vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ::operator[](&this->segmentPoints,(long)this->segmentNos);
              pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                                  (pvVar9,(long)dc_5);
              iVar5 = dr_5;
              startIndex_1 = iVar6 - pvVar10->y;
              if (startIndex_1 < 1) {
                startIndex_1 = -startIndex_1;
              }
              pvVar9 = std::
                       vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ::operator[](&this->segmentPoints,(long)this->segmentNos);
              pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                                  (pvVar9,(long)dc_5);
              chainLen_2 = iVar5 - pvVar10->x;
              if (chainLen_2 < 1) {
                chainLen_2 = -chainLen_2;
              }
              if ((1 < startIndex_1) || (1 < chainLen_2)) break;
              pvVar9 = std::
                       vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ::operator[](&this->segmentPoints,(long)this->segmentNos);
              std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::pop_back(pvVar9);
              count = count + -1;
            }
            fr_5 = 0;
            fc_5 = A[(long)fc_4 * 8 + 1];
            if ((1 < fc_5) && (0 < count)) {
              iVar6 = *(int *)(*(long *)(A + (long)fc_4 * 8 + 6) + 0xc);
              dc_6 = *(int *)(*(long *)(A + (long)fc_4 * 8 + 6) + 8);
              dr_6 = iVar6;
              pvVar9 = std::
                       vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ::operator[](&this->segmentPoints,(long)this->segmentNos);
              pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                                  (pvVar9,(long)(count + -1));
              iVar5 = dc_6;
              l_2 = iVar6 - pvVar10->y;
              if (l_2 < 1) {
                l_2 = -l_2;
              }
              pvVar9 = std::
                       vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ::operator[](&this->segmentPoints,(long)this->segmentNos);
              pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                                  (pvVar9,(long)(count + -1));
              local_1a4 = iVar5 - pvVar10->x;
              if (local_1a4 < 1) {
                local_1a4 = -local_1a4;
              }
              if ((l_2 < 2) && (local_1a4 < 2)) {
                fr_5 = 1;
              }
            }
            for (local_1a8 = fr_5; local_1a8 < A[(long)fc_4 * 8 + 1]; local_1a8 = local_1a8 + 1) {
              pvVar9 = std::
                       vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ::operator[](&this->segmentPoints,(long)this->segmentNos);
              std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::push_back
                        (pvVar9,(value_type *)
                                (*(long *)(A + (long)fc_4 * 8 + 6) + (long)local_1a8 * 8));
              count = count + 1;
            }
            A[(long)fc_4 * 8 + 1] = 0;
          }
          local_1c8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1c8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1c8.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&local_1c8);
          std::
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ::push_back(&this->segmentPoints,&local_1c8);
          std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector(&local_1c8);
          this->segmentNos = this->segmentNos + 1;
        }
      }
    }
  } while( true );
}

Assistant:

void ED::JoinAnchorPointsUsingSortedAnchors()
{
	int *chainNos = new int[(width + height) * 8];

	Point *pixels = new Point[width*height];
	StackNode *stack = new StackNode[width*height];
	Chain *chains = new Chain[width*height];

	// sort the anchor points by their gradient value in decreasing order
	int *A = sortAnchorsByGradValue1();

	// Now join the anchors starting with the anchor having the greatest gradient value
	int totalPixels = 0;

	for (int k = anchorNos - 1; k >= 0; k--) {
		int pixelOffset = A[k];

		int i = pixelOffset / width;
		int j = pixelOffset % width;

		//int i = anchorPoints[k].y;
		//int j = anchorPoints[k].x;

		if (edgeImg[i*width + j] != ANCHOR_PIXEL) continue;

		chains[0].len = 0;
		chains[0].parent = -1;
		chains[0].dir = 0;
		chains[0].children[0] = chains[0].children[1] = -1;
		chains[0].pixels = NULL;


		int noChains = 1;
		int len = 0;
		int duplicatePixelCount = 0;
		int top = -1;  // top of the stack 

		if (dirImg[i*width + j] == EDGE_VERTICAL) {
			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_DOWN;
			stack[top].parent = 0;

			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_UP;
			stack[top].parent = 0;

		}
		else {
			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_RIGHT;
			stack[top].parent = 0;

			stack[++top].r = i;
			stack[top].c = j;
			stack[top].dir = ED_LEFT;
			stack[top].parent = 0;
		} //end-else

		  // While the stack is not empty
	StartOfWhile:
		while (top >= 0) {
			int r = stack[top].r;
			int c = stack[top].c;
			int dir = stack[top].dir;
			int parent = stack[top].parent;
			top--;

			if (edgeImg[r*width + c] != EDGE_PIXEL) duplicatePixelCount++;

			chains[noChains].dir = dir;   // traversal direction
			chains[noChains].parent = parent;
			chains[noChains].children[0] = chains[noChains].children[1] = -1;


			int chainLen = 0;

			chains[noChains].pixels = &pixels[len];

			pixels[len].y = r;
			pixels[len].x = c;
			len++;
			chainLen++;

			if (dir == ED_LEFT) {
				while (dirImg[r*width + c] == EDGE_HORIZONTAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is horizontal. Look LEFT
					//
					//   A
					//   B x 
					//   C 
					//
					// cleanup up & down pixels
					if (edgeImg[(r - 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r - 1)*width + c] = 0;
					if (edgeImg[(r + 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r + 1)*width + c] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[r*width + c - 1] >= ANCHOR_PIXEL) { c--; }
					else if (edgeImg[(r - 1)*width + c - 1] >= ANCHOR_PIXEL) { r--; c--; }
					else if (edgeImg[(r + 1)*width + c - 1] >= ANCHOR_PIXEL) { r++; c--; }
					else {
						// else -- follow max. pixel to the LEFT
						int A = gradImg[(r - 1)*width + c - 1];
						int B = gradImg[r*width + c - 1];
						int C = gradImg[(r + 1)*width + c - 1];

						if (A > B) {
							if (A > C) r--;
							else       r++;
						}
						else  if (C > B) r++;
						c--;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[0] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else


					pixels[len].y = r;
					pixels[len].x = c;
					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_DOWN;
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_UP;
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[0] = noChains;
				noChains++;

			}
			else if (dir == ED_RIGHT) {
				while (dirImg[r*width + c] == EDGE_HORIZONTAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is horizontal. Look RIGHT
					//
					//     A
					//   x B
					//     C
					//
					// cleanup up&down pixels
					if (edgeImg[(r + 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r + 1)*width + c] = 0;
					if (edgeImg[(r - 1)*width + c] == ANCHOR_PIXEL) edgeImg[(r - 1)*width + c] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[r*width + c + 1] >= ANCHOR_PIXEL) { c++; }
					else if (edgeImg[(r + 1)*width + c + 1] >= ANCHOR_PIXEL) { r++; c++; }
					else if (edgeImg[(r - 1)*width + c + 1] >= ANCHOR_PIXEL) { r--; c++; }
					else {
						// else -- follow max. pixel to the RIGHT
						int A = gradImg[(r - 1)*width + c + 1];
						int B = gradImg[r*width + c + 1];
						int C = gradImg[(r + 1)*width + c + 1];

						if (A > B) {
							if (A > C) r--;       // A
							else       r++;       // C
						}
						else if (C > B) r++;  // C
						c++;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[1] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else


					pixels[len].y = r;
					pixels[len].x = c;
					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_DOWN;  // Go down
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_UP;   // Go up
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[1] = noChains;
				noChains++;

			}
			else if (dir == ED_UP) {
				while (dirImg[r*width + c] == EDGE_VERTICAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is vertical. Look UP
					//
					//   A B C
					//     x
					//
					// Cleanup left & right pixels
					if (edgeImg[r*width + c - 1] == ANCHOR_PIXEL) edgeImg[r*width + c - 1] = 0;
					if (edgeImg[r*width + c + 1] == ANCHOR_PIXEL) edgeImg[r*width + c + 1] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[(r - 1)*width + c] >= ANCHOR_PIXEL) { r--; }
					else if (edgeImg[(r - 1)*width + c - 1] >= ANCHOR_PIXEL) { r--; c--; }
					else if (edgeImg[(r - 1)*width + c + 1] >= ANCHOR_PIXEL) { r--; c++; }
					else {
						// else -- follow the max. pixel UP
						int A = gradImg[(r - 1)*width + c - 1];
						int B = gradImg[(r - 1)*width + c];
						int C = gradImg[(r - 1)*width + c + 1];

						if (A > B) {
							if (A > C) c--;
							else       c++;
						}
						else if (C > B) c++;
						r--;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[0] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else


					pixels[len].y = r;
					pixels[len].x = c;

					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_RIGHT;
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_LEFT;
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[0] = noChains;
				noChains++;

			}
			else { // dir == DOWN
				while (dirImg[r*width + c] == EDGE_VERTICAL) {
					edgeImg[r*width + c] = EDGE_PIXEL;

					// The edge is vertical
					//
					//     x
					//   A B C
					//
					// cleanup side pixels
					if (edgeImg[r*width + c + 1] == ANCHOR_PIXEL) edgeImg[r*width + c + 1] = 0;
					if (edgeImg[r*width + c - 1] == ANCHOR_PIXEL) edgeImg[r*width + c - 1] = 0;

					// Look if there is an edge pixel in the neighbors
					if (edgeImg[(r + 1)*width + c] >= ANCHOR_PIXEL) { r++; }
					else if (edgeImg[(r + 1)*width + c + 1] >= ANCHOR_PIXEL) { r++; c++; }
					else if (edgeImg[(r + 1)*width + c - 1] >= ANCHOR_PIXEL) { r++; c--; }
					else {
						// else -- follow the max. pixel DOWN
						int A = gradImg[(r + 1)*width + c - 1];
						int B = gradImg[(r + 1)*width + c];
						int C = gradImg[(r + 1)*width + c + 1];

						if (A > B) {
							if (A > C) c--;       // A
							else       c++;       // C
						}
						else if (C > B) c++;  // C
						r++;
					} //end-else

					if (edgeImg[r*width + c] == EDGE_PIXEL || gradImg[r*width + c] < gradThresh) {
						if (chainLen > 0) {
							chains[noChains].len = chainLen;
							chains[parent].children[1] = noChains;
							noChains++;
						} // end-if
						goto StartOfWhile;
					} //end-else

					pixels[len].y = r;
					pixels[len].x = c;

					len++;
					chainLen++;
				} //end-while

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_RIGHT;
				stack[top].parent = noChains;

				stack[++top].r = r;
				stack[top].c = c;
				stack[top].dir = ED_LEFT;
				stack[top].parent = noChains;

				len--;
				chainLen--;

				chains[noChains].len = chainLen;
				chains[parent].children[1] = noChains;
				noChains++;
			} //end-else

		} //end-while


		if (len - duplicatePixelCount < minPathLen) {
			for (int k = 0; k<len; k++) {

				edgeImg[pixels[k].y*width + pixels[k].x] = 0;
				edgeImg[pixels[k].y*width + pixels[k].x] = 0;

			} //end-for

		}
		else {

			int noSegmentPixels = 0;

			int totalLen = LongestChain(chains, chains[0].children[1]);

			if (totalLen > 0) {
				// Retrieve the chainNos
				int count = RetrieveChainNos(chains, chains[0].children[1], chainNos);

				// Copy these pixels in the reverse order
				for (int k = count - 1; k >= 0; k--) {
					int chainNo = chainNos[k];

#if 1
					/* See if we can erase some pixels from the last chain. This is for cleanup */

					int fr = chains[chainNo].pixels[chains[chainNo].len - 1].y;
					int fc = chains[chainNo].pixels[chains[chainNo].len - 1].x;

					int index = noSegmentPixels - 2;
					while (index >= 0) {
						int dr = abs(fr - segmentPoints[segmentNos][index].y);
						int dc = abs(fc - segmentPoints[segmentNos][index].x);

						if (dr <= 1 && dc <= 1) {
							// neighbors. Erase last pixel
							segmentPoints[segmentNos].pop_back();
							noSegmentPixels--;
							index--;
						}
						else break;
					} //end-while

					if (chains[chainNo].len > 1 && noSegmentPixels > 0) {
						fr = chains[chainNo].pixels[chains[chainNo].len - 2].y;
						fc = chains[chainNo].pixels[chains[chainNo].len - 2].x;

						int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
						int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);

						if (dr <= 1 && dc <= 1) chains[chainNo].len--;
					} //end-if
#endif

					for (int l = chains[chainNo].len - 1; l >= 0; l--) {
						segmentPoints[segmentNos].push_back(chains[chainNo].pixels[l]);
						noSegmentPixels++;
					} //end-for

					chains[chainNo].len = 0;  // Mark as copied
				} //end-for
			} //end-if

			totalLen = LongestChain(chains, chains[0].children[0]);
			if (totalLen > 1) {
				// Retrieve the chainNos
				int count = RetrieveChainNos(chains, chains[0].children[0], chainNos);

				// Copy these chains in the forward direction. Skip the first pixel of the first chain
				// due to repetition with the last pixel of the previous chain
				int lastChainNo = chainNos[0];
				chains[lastChainNo].pixels++;
				chains[lastChainNo].len--;

				for (int k = 0; k<count; k++) {
					int chainNo = chainNos[k];

#if 1
					/* See if we can erase some pixels from the last chain. This is for cleanup */
					int fr = chains[chainNo].pixels[0].y;
					int fc = chains[chainNo].pixels[0].x;

					int index = noSegmentPixels - 2;
					while (index >= 0) {
						int dr = abs(fr - segmentPoints[segmentNos][index].y);
						int dc = abs(fc - segmentPoints[segmentNos][index].x);

						if (dr <= 1 && dc <= 1) {
							// neighbors. Erase last pixel
							segmentPoints[segmentNos].pop_back();
							noSegmentPixels--;
							index--;
						}
						else break;
					} //end-while

					int startIndex = 0;
					int chainLen = chains[chainNo].len;
					if (chainLen > 1 && noSegmentPixels > 0) {
						int fr = chains[chainNo].pixels[1].y;
						int fc = chains[chainNo].pixels[1].x;

						int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
						int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);

						if (dr <= 1 && dc <= 1) { startIndex = 1; }
					} //end-if
#endif

					  /* Start a new chain & copy pixels from the new chain */
					for (int l = startIndex; l<chains[chainNo].len; l++) {
						segmentPoints[segmentNos].push_back(chains[chainNo].pixels[l]);
						noSegmentPixels++;
					} //end-for

					chains[chainNo].len = 0;  // Mark as copied
				} //end-for
			} //end-if


			  // See if the first pixel can be cleaned up
			int fr = segmentPoints[segmentNos][1].y;
			int fc = segmentPoints[segmentNos][1].x;


			int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
			int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);


			if (dr <= 1 && dc <= 1) {
				segmentPoints[segmentNos].erase(segmentPoints[segmentNos].begin());
				noSegmentPixels--;
			} //end-if

			segmentNos++;
			segmentPoints.push_back(vector<Point>()); // create empty vector of points for segments

													  // Copy the rest of the long chains here
			for (int k = 2; k<noChains; k++) {
				if (chains[k].len < 2) continue;

				totalLen = LongestChain(chains, k);

				if (totalLen >= 10) {

					// Retrieve the chainNos
					int count = RetrieveChainNos(chains, k, chainNos);

					// Copy the pixels
					noSegmentPixels = 0;
					for (int k = 0; k<count; k++) {
						int chainNo = chainNos[k];

#if 1					
						/* See if we can erase some pixels from the last chain. This is for cleanup */
						int fr = chains[chainNo].pixels[0].y;
						int fc = chains[chainNo].pixels[0].x;

						int index = noSegmentPixels - 2;
						while (index >= 0) {
							int dr = abs(fr - segmentPoints[segmentNos][index].y);
							int dc = abs(fc - segmentPoints[segmentNos][index].x);

							if (dr <= 1 && dc <= 1) {
								// neighbors. Erase last pixel
								segmentPoints[segmentNos].pop_back();
								noSegmentPixels--;
								index--;
							}
							else break;
						} //end-while

						int startIndex = 0;
						int chainLen = chains[chainNo].len;
						if (chainLen > 1 && noSegmentPixels > 0) {
							int fr = chains[chainNo].pixels[1].y;
							int fc = chains[chainNo].pixels[1].x;

							int dr = abs(fr - segmentPoints[segmentNos][noSegmentPixels - 1].y);
							int dc = abs(fc - segmentPoints[segmentNos][noSegmentPixels - 1].x);

							if (dr <= 1 && dc <= 1) { startIndex = 1; }
						} //end-if
#endif
						  /* Start a new chain & copy pixels from the new chain */
						for (int l = startIndex; l<chains[chainNo].len; l++) {
							segmentPoints[segmentNos].push_back(chains[chainNo].pixels[l]);
							noSegmentPixels++;
						} //end-for

						chains[chainNo].len = 0;  // Mark as copied
					} //end-for
					segmentPoints.push_back(vector<Point>()); // create empty vector of points for segments
					segmentNos++;
				} //end-if          
			} //end-for

		} //end-else

	} //end-for-outer

	// pop back last segment from vector
	// because of one preallocation in the beginning, it will always empty
	segmentPoints.pop_back();

	// Clean up
	delete[] A;
	delete[] chains;
	delete[] stack;
	delete[] chainNos;
	delete[] pixels;
}